

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xinerama.c
# Opt level: O0

natwm_error xinerama_get_screens(natwm_state *state,xcb_rectangle_t **destination,size_t *count)

{
  undefined4 uVar1;
  int iVar2;
  void *__ptr;
  long lVar3;
  xcb_rectangle_t *pxVar4;
  xcb_rectangle_t screen_rect;
  xcb_xinerama_screen_info_t screen_info;
  size_t i;
  xcb_rectangle_t *screen_rects;
  int screen_count;
  xcb_xinerama_screen_info_t *screens_info;
  xcb_xinerama_query_screens_reply_t *query_screens_reply;
  long lStack_30;
  xcb_xinerama_query_screens_cookie_t query_screens_cookie;
  xcb_generic_error_t *err;
  size_t *count_local;
  xcb_rectangle_t **destination_local;
  natwm_state *state_local;
  
  lStack_30 = 0;
  uVar1 = xcb_xinerama_query_screens(state->xcb);
  __ptr = (void *)xcb_xinerama_query_screens_reply(state->xcb,uVar1,&stack0xffffffffffffffd0);
  if (lStack_30 == 0) {
    lVar3 = xcb_xinerama_query_screens_screen_info(__ptr);
    if (lVar3 == 0) {
      internal_logger(natwm_logger,LEVEL_INFO,"Failed to get xinerama screen info");
      state_local._4_4_ = GENERIC_ERROR;
    }
    else {
      iVar2 = xcb_xinerama_query_screens_screen_info_length(__ptr);
      if (iVar2 < 1) {
        __assert_fail("screen_count > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/cfrank[P]natwm/src/core/xinerama.c"
                      ,0x3e,
                      "enum natwm_error xinerama_get_screens(const struct natwm_state *, xcb_rectangle_t **, size_t *)"
                     );
      }
      pxVar4 = (xcb_rectangle_t *)malloc((long)iVar2 << 3);
      if (pxVar4 == (xcb_rectangle_t *)0x0) {
        state_local._4_4_ = MEMORY_ALLOCATION_ERROR;
      }
      else {
        screen_info.x_org = 0;
        screen_info.y_org = 0;
        screen_info.width = 0;
        screen_info.height = 0;
        for (; (ulong)screen_info < (ulong)(long)iVar2;
            screen_info = (xcb_xinerama_screen_info_t)((long)screen_info + 1)) {
          pxVar4[(long)screen_info] = *(xcb_rectangle_t *)(lVar3 + (long)screen_info * 8);
        }
        *destination = pxVar4;
        *count = (long)iVar2;
        free(__ptr);
        state_local._4_4_ = NO_ERROR;
      }
    }
  }
  else {
    internal_logger(natwm_logger,LEVEL_INFO,"Failed to get xinerama screens");
    free(__ptr);
    state_local._4_4_ = GENERIC_ERROR;
  }
  return state_local._4_4_;
}

Assistant:

enum natwm_error xinerama_get_screens(const struct natwm_state *state,
                                      xcb_rectangle_t **destination, size_t *count)
{
        xcb_generic_error_t *err = XCB_NONE;

        xcb_xinerama_query_screens_cookie_t query_screens_cookie
                = xcb_xinerama_query_screens(state->xcb);
        xcb_xinerama_query_screens_reply_t *query_screens_reply
                = xcb_xinerama_query_screens_reply(state->xcb, query_screens_cookie, &err);

        if (err != XCB_NONE) {
                LOG_INFO(natwm_logger, "Failed to get xinerama screens");

                free(query_screens_reply);

                return GENERIC_ERROR;
        }

        xcb_xinerama_screen_info_t *screens_info
                = xcb_xinerama_query_screens_screen_info(query_screens_reply);

        if (screens_info == NULL) {
                LOG_INFO(natwm_logger, "Failed to get xinerama screen info");

                return GENERIC_ERROR;
        }

        int screen_count = xcb_xinerama_query_screens_screen_info_length(query_screens_reply);

        assert(screen_count > 0);

        xcb_rectangle_t *screen_rects = malloc(sizeof(xcb_rectangle_t) * (size_t)screen_count);

        if (screen_rects == NULL) {
                return MEMORY_ALLOCATION_ERROR;
        }

        for (size_t i = 0; i < (size_t)screen_count; ++i) {
                xcb_xinerama_screen_info_t screen_info = screens_info[i];
                xcb_rectangle_t screen_rect = {
                        .x = screen_info.x_org,
                        .y = screen_info.y_org,
                        .width = screen_info.width,
                        .height = screen_info.height,
                };

                screen_rects[i] = screen_rect;
        }

        *destination = screen_rects;
        *count = (size_t)screen_count;

        free(query_screens_reply);

        return NO_ERROR;
}